

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_inflate.c
# Opt level: O2

REF_STATUS ref_inflate_sort_rail(REF_INT n,REF_DBL *x,REF_DBL *yz,REF_DBL *phi)

{
  size_t __size;
  uint uVar1;
  REF_INT *sorted_index;
  void *__ptr;
  ulong uVar2;
  size_t sVar3;
  undefined8 uVar4;
  REF_STATUS RVar5;
  char *pcVar6;
  ulong uVar7;
  
  if (n < 0) {
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_inflate.c",0x1b3
           ,"ref_inflate_sort_rail","malloc order of REF_INT negative");
    RVar5 = 1;
  }
  else {
    uVar7 = (ulong)(uint)n;
    sorted_index = (REF_INT *)malloc(uVar7 * 4);
    if (sorted_index == (REF_INT *)0x0) {
      pcVar6 = "malloc order of REF_INT NULL";
      uVar4 = 0x1b3;
    }
    else {
      __size = uVar7 * 8;
      __ptr = malloc(__size);
      if (__ptr != (void *)0x0) {
        uVar1 = ref_sort_heap_dbl(n,x,sorted_index);
        if (uVar1 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_inflate.c"
                 ,0x1b5,"ref_inflate_sort_rail",(ulong)uVar1,"heap");
          return uVar1;
        }
        for (uVar2 = 0; uVar7 != uVar2; uVar2 = uVar2 + 1) {
          *(REF_DBL *)((long)__ptr + uVar2 * 8) = x[sorted_index[uVar2]];
        }
        for (uVar2 = 0; uVar7 != uVar2; uVar2 = uVar2 + 1) {
          x[uVar2] = *(REF_DBL *)((long)__ptr + uVar2 * 8);
        }
        for (uVar2 = 0; uVar7 != uVar2; uVar2 = uVar2 + 1) {
          *(REF_DBL *)((long)__ptr + uVar2 * 8) = yz[(long)sorted_index[uVar2] * 2];
        }
        for (sVar3 = 0; __size != sVar3; sVar3 = sVar3 + 8) {
          *(undefined8 *)((long)yz + sVar3 * 2) = *(undefined8 *)((long)__ptr + sVar3);
        }
        for (uVar2 = 0; uVar7 != uVar2; uVar2 = uVar2 + 1) {
          *(REF_DBL *)((long)__ptr + uVar2 * 8) = yz[(long)sorted_index[uVar2] * 2 + 1];
        }
        for (sVar3 = 0; __size != sVar3; sVar3 = sVar3 + 8) {
          *(undefined8 *)((long)yz + sVar3 * 2 + 8) = *(undefined8 *)((long)__ptr + sVar3);
        }
        for (uVar2 = 0; uVar7 != uVar2; uVar2 = uVar2 + 1) {
          *(REF_DBL *)((long)__ptr + uVar2 * 8) = phi[sorted_index[uVar2]];
        }
        for (uVar2 = 0; uVar7 != uVar2; uVar2 = uVar2 + 1) {
          phi[uVar2] = *(REF_DBL *)((long)__ptr + uVar2 * 8);
        }
        free(__ptr);
        free(sorted_index);
        return 0;
      }
      pcVar6 = "malloc tmp of REF_DBL NULL";
      uVar4 = 0x1b4;
    }
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_inflate.c",uVar4
           ,"ref_inflate_sort_rail",pcVar6);
    RVar5 = 2;
  }
  return RVar5;
}

Assistant:

REF_FCN static REF_STATUS ref_inflate_sort_rail(REF_INT n, REF_DBL *x,
                                                REF_DBL *yz, REF_DBL *phi) {
  REF_INT node;
  REF_INT *order;
  REF_DBL *tmp;
  ref_malloc(order, n, REF_INT);
  ref_malloc(tmp, n, REF_DBL);
  RSS(ref_sort_heap_dbl(n, x, order), "heap");
  for (node = 0; node < n; node++) {
    tmp[node] = x[order[node]];
  }
  for (node = 0; node < n; node++) {
    x[node] = tmp[node];
  }
  for (node = 0; node < n; node++) {
    tmp[node] = yz[0 + 2 * order[node]];
  }
  for (node = 0; node < n; node++) {
    yz[0 + 2 * node] = tmp[node];
  }
  for (node = 0; node < n; node++) {
    tmp[node] = yz[1 + 2 * order[node]];
  }
  for (node = 0; node < n; node++) {
    yz[1 + 2 * node] = tmp[node];
  }
  for (node = 0; node < n; node++) {
    tmp[node] = phi[order[node]];
  }
  for (node = 0; node < n; node++) {
    phi[node] = tmp[node];
  }
  ref_free(tmp);
  ref_free(order);
  return REF_SUCCESS;
}